

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

string * __thiscall
google::protobuf::internal::ExtensionSet::AddString_abi_cxx11_
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor)

{
  int iVar1;
  ArenaImpl *pAVar2;
  RepeatedPtrFieldBase *this_00;
  Rep *pRVar3;
  Extension *pEVar4;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar5;
  string *psVar6;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar7;
  
  pVar7 = Insert(this,number);
  pEVar4 = pVar7.first;
  pEVar4->descriptor = descriptor;
  if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pEVar4->type = type;
    pEVar4->is_repeated = true;
    pEVar4->is_packed = false;
    pAVar2 = (ArenaImpl *)this->arena_;
    if (pAVar2 == (ArenaImpl *)0x0) {
      pRVar5 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)operator_new(0x18);
      (pRVar5->super_RepeatedPtrFieldBase).arena_ = (Arena *)0x0;
      (pRVar5->super_RepeatedPtrFieldBase).current_size_ = 0;
      (pRVar5->super_RepeatedPtrFieldBase).total_size_ = 0;
      (pRVar5->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
    }
    else {
      if ((pAVar2->lifecycle_id_ & 1) != 0) {
        AddString_abi_cxx11_((ExtensionSet *)pAVar2);
      }
      pRVar5 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)ArenaImpl::AllocateAlignedAndAddCleanup
                            (pAVar2,0x18,
                             arena_destruct_object<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                            );
      (pRVar5->super_RepeatedPtrFieldBase).arena_ = (Arena *)pAVar2;
      (pRVar5->super_RepeatedPtrFieldBase).current_size_ = 0;
      (pRVar5->super_RepeatedPtrFieldBase).total_size_ = 0;
      (pRVar5->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
    }
    (pEVar4->field_0).repeated_string_value = pRVar5;
  }
  this_00 = &((pEVar4->field_0).repeated_string_value)->super_RepeatedPtrFieldBase;
  pRVar3 = this_00->rep_;
  if (pRVar3 != (Rep *)0x0) {
    iVar1 = this_00->current_size_;
    if (iVar1 < pRVar3->allocated_size) {
      this_00->current_size_ = iVar1 + 1;
      return (string *)pRVar3->elements[iVar1];
    }
    if (pRVar3->allocated_size != this_00->total_size_) goto LAB_00200cad;
  }
  RepeatedPtrFieldBase::Reserve(this_00,this_00->total_size_ + 1);
LAB_00200cad:
  this_00->rep_->allocated_size = this_00->rep_->allocated_size + 1;
  pAVar2 = (ArenaImpl *)this_00->arena_;
  if (pAVar2 == (ArenaImpl *)0x0) {
    psVar6 = (string *)operator_new(0x20);
  }
  else {
    if ((pAVar2->lifecycle_id_ & 1) != 0) {
      AddString_abi_cxx11_((ExtensionSet *)pAVar2);
    }
    psVar6 = (string *)
             ArenaImpl::AllocateAlignedAndAddCleanup
                       (pAVar2,0x20,arena_destruct_object<std::__cxx11::string>);
  }
  (psVar6->_M_dataplus)._M_p = (pointer)&psVar6->field_2;
  psVar6->_M_string_length = 0;
  (psVar6->field_2)._M_local_buf[0] = '\0';
  iVar1 = this_00->current_size_;
  this_00->current_size_ = iVar1 + 1;
  this_00->rep_->elements[iVar1] = psVar6;
  return psVar6;
}

Assistant:

std::string* ExtensionSet::AddString(int number, FieldType type,
                                     const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_STRING);
    extension->is_repeated = true;
    extension->is_packed = false;
    extension->repeated_string_value =
        Arena::CreateMessage<RepeatedPtrField<std::string>>(arena_);
  } else {
    GOOGLE_DCHECK_TYPE(*extension, REPEATED_FIELD, STRING);
  }
  return extension->repeated_string_value->Add();
}